

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,matrix3d *m)

{
  ostream *poVar1;
  char *pcVar2;
  _anonymous_namespace_ *p_Var3;
  string local_90;
  string local_70;
  string local_50;
  
  std::operator<<(ofs,"( ");
  pcVar2 = "(";
  poVar1 = std::operator<<(ofs,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)pcVar2,m->m[0][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  p_Var3 = (_anonymous_namespace_ *)0x205f76;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var3,m->m[0][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  p_Var3 = (_anonymous_namespace_ *)0x205f76;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var3,m->m[0][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,"), ");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pcVar2 = "(";
  poVar1 = std::operator<<(ofs,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)pcVar2,m->m[1][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  p_Var3 = (_anonymous_namespace_ *)0x205f76;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var3,m->m[1][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  p_Var3 = (_anonymous_namespace_ *)0x205f76;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var3,m->m[1][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,"), ");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pcVar2 = "(";
  poVar1 = std::operator<<(ofs,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)pcVar2,m->m[2][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  p_Var3 = (_anonymous_namespace_ *)0x205f76;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var3,m->m[2][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  p_Var3 = (_anonymous_namespace_ *)0x205f76;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var3,m->m[2][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,")");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::operator<<(ofs," )");
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::matrix3d &m) {
  ofs << "( ";

  ofs << "(" << tinyusdz::dtos(m.m[0][0]) << ", " << tinyusdz::dtos(m.m[0][1])
      << ", " << tinyusdz::dtos(m.m[0][2]) << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[1][0]) << ", " << tinyusdz::dtos(m.m[1][1])
      << ", " << tinyusdz::dtos(m.m[1][2]) << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[2][0]) << ", " << tinyusdz::dtos(m.m[2][1])
      << ", " << tinyusdz::dtos(m.m[2][2]) << ")";

  ofs << " )";

  return ofs;
}